

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

uint64_t connection_handle_deadlines(CONNECTION_HANDLE connection)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ulong uVar3;
  char *description;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  tickcounter_ms_t current_ms;
  tickcounter_ms_t local_20;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"connection_handle_deadlines",0x6e3,1,"NULL connection");
    }
  }
  else {
    iVar1 = tickcounter_get_current_ms(connection->tick_counter,&local_20);
    if (iVar1 == 0) {
      uVar4 = 0xffffffffffffffff;
      uVar6 = 0xffffffffffffffff;
      if (((connection->field_0xe0 & 2) == 0) ||
         (uVar3 = (ulong)connection->idle_timeout, uVar3 == 0)) {
LAB_0016568e:
        if (connection->remote_idle_timeout == 0) goto LAB_00165637;
        uVar5 = (ulong)connection->remote_idle_timeout_send_frame_millisecond;
        uVar3 = local_20 - connection->last_frame_sent_time;
        uVar4 = uVar5 - uVar3;
        if (uVar3 <= uVar5 && uVar4 != 0) goto LAB_00165637;
        connection->on_send_complete = (ON_SEND_COMPLETE)0x0;
        iVar1 = amqp_frame_codec_encode_empty_frame
                          (connection->amqp_frame_codec,0,on_bytes_encoded,connection);
        if (iVar1 == 0) {
          if (((connection->field_0xe0 & 8) != 0) &&
             (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
            (*p_Var2)(AZ_LOG_TRACE,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                      ,"connection_handle_deadlines",0x71a,1,"-> Empty frame");
          }
          connection->last_frame_sent_time = local_20;
          uVar4 = uVar5;
          goto LAB_00165637;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                    ,"connection_handle_deadlines",0x712,1,"Encoding the empty frame failed");
        }
        description = "Cannot send empty frame";
      }
      else {
        uVar6 = local_20 - connection->last_frame_received_time;
        if (uVar6 < uVar3) {
          uVar6 = uVar3 - uVar6;
          if (uVar6 == 0) {
            uVar6 = 0;
            goto LAB_00165637;
          }
          goto LAB_0016568e;
        }
        description = "No frame received for the idle timeout";
        uVar6 = 0;
      }
      close_connection_with_error(connection,"amqp:internal-error",description,(AMQP_VALUE)0x0);
      uVar4 = 0xffffffffffffffff;
      goto LAB_00165637;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"connection_handle_deadlines",0x6eb,1,"Could not get tick counter value");
    }
    close_connection_with_error
              (connection,"amqp:internal-error","Could not get tick count",(AMQP_VALUE)0x0);
  }
  uVar6 = 0xffffffffffffffff;
  uVar4 = 0xffffffffffffffff;
LAB_00165637:
  if (uVar6 < uVar4) {
    uVar4 = uVar6;
  }
  return uVar4;
}

Assistant:

uint64_t connection_handle_deadlines(CONNECTION_HANDLE connection)
{
    uint64_t local_deadline = (uint64_t)-1;
    uint64_t remote_deadline = (uint64_t)-1;

    if (connection == NULL)
    {
        LogError("NULL connection");
    }
    else
    {
        tickcounter_ms_t current_ms;

        if (tickcounter_get_current_ms(connection->tick_counter, &current_ms) != 0)
        {
            LogError("Could not get tick counter value");
            close_connection_with_error(connection, "amqp:internal-error", "Could not get tick count", NULL);
        }
        else
        {
            if (connection->idle_timeout_specified && (connection->idle_timeout != 0))
            {
                /* Calculate time until configured idle timeout expires */

                uint64_t time_since_last_received = current_ms - connection->last_frame_received_time;
                if (time_since_last_received < connection->idle_timeout)
                {
                    local_deadline = connection->idle_timeout - time_since_last_received;
                }
                else
                {
                    local_deadline = 0;

                    /* close connection */
                    close_connection_with_error(connection, "amqp:internal-error", "No frame received for the idle timeout", NULL);
                }
            }

            if (local_deadline != 0 && connection->remote_idle_timeout != 0)
            {
                /* Calculate time until remote idle timeout expires */

                uint64_t remote_idle_timeout = connection->remote_idle_timeout_send_frame_millisecond;
                uint64_t time_since_last_sent = current_ms - connection->last_frame_sent_time;

                if (time_since_last_sent < remote_idle_timeout)
                {
                    remote_deadline = remote_idle_timeout - time_since_last_sent;
                }
                else
                {
                    connection->on_send_complete = NULL;
                    if (amqp_frame_codec_encode_empty_frame(connection->amqp_frame_codec, 0, on_bytes_encoded, connection) != 0)
                    {
                        LogError("Encoding the empty frame failed");
                        /* close connection */
                        close_connection_with_error(connection, "amqp:internal-error", "Cannot send empty frame", NULL);
                    }
                    else
                    {
                        if (connection->is_trace_on == 1)
                        {
                            LOG(AZ_LOG_TRACE, LOG_LINE, "-> Empty frame");
                        }

                        connection->last_frame_sent_time = current_ms;

                        remote_deadline = remote_idle_timeout;
                    }
                }
            }
        }
    }

    /* Return the shorter of each deadline, or 0 to indicate connection closed */
    return local_deadline > remote_deadline ? remote_deadline : local_deadline;
}